

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

void __thiscall llama_model::llama_model(llama_model *this,llama_model_params *params)

{
  undefined8 uVar1;
  undefined8 uVar2;
  size_type sVar3;
  size_type sVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  size_type sVar7;
  pointer piVar8;
  undefined8 *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  bool local_79;
  llama_vocab *in_stack_ffffffffffffff90;
  allocator<char> *in_stack_ffffffffffffffb0;
  size_t __n;
  char *in_stack_ffffffffffffffb8;
  allocator<char> local_11;
  undefined8 *local_10;
  
  *(undefined4 *)in_RDI = 0;
  *(undefined4 *)&in_RDI->field_0x4 = 0x42;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RDI,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::allocator<char>::~allocator(&local_11);
  *(undefined1 *)&in_RDI[1]._M_string_length = 0;
  *(undefined1 *)((long)&in_RDI[1]._M_string_length + 1) = 0;
  *(undefined1 *)((long)&in_RDI[1]._M_string_length + 2) = 0;
  *(undefined1 *)((long)&in_RDI[1]._M_string_length + 3) = 0;
  *(undefined4 *)((long)&in_RDI[1]._M_string_length + 4) = 0;
  *(undefined4 *)&in_RDI[1].field_2 = 0;
  *(undefined4 *)((long)&in_RDI[1].field_2 + 4) = 0;
  *(undefined4 *)((long)&in_RDI[1].field_2 + 8) = 0;
  *(undefined4 *)((long)&in_RDI[1].field_2 + 0xc) = 0;
  *(undefined4 *)(in_RDI + 2) = 0;
  *(undefined4 *)&in_RDI[2].field_0x4 = 1;
  *(undefined4 *)&in_RDI[2]._M_string_length = 0;
  *(undefined4 *)((long)&in_RDI[2]._M_string_length + 4) = 0;
  *(undefined4 *)&in_RDI[2].field_2 = 0;
  *(undefined4 *)((long)&in_RDI[2].field_2 + 4) = 0;
  *(undefined4 *)((long)&in_RDI[2].field_2 + 8) = 0;
  *(undefined4 *)((long)&in_RDI[2].field_2 + 0xc) = 0;
  *(undefined4 *)(in_RDI + 3) = 0;
  *(undefined4 *)&in_RDI[3].field_0x4 = 0;
  *(undefined4 *)&in_RDI[3]._M_string_length = 0;
  *(undefined4 *)((long)&in_RDI[3]._M_string_length + 4) = 0;
  *(undefined4 *)&in_RDI[3].field_2 = 0;
  __n = 0x800;
  memset((void *)((long)&in_RDI[3].field_2 + 4),0,0x800);
  memset((void *)((long)&in_RDI[0x43].field_2 + 4),0,__n);
  memset((void *)((long)&in_RDI[0x83].field_2 + 4),0,__n);
  *(undefined4 *)((long)&in_RDI[0xc3].field_2 + 4) = 0;
  *(undefined4 *)((long)&in_RDI[0xc3].field_2 + 8) = 0;
  *(undefined4 *)((long)&in_RDI[0xc3].field_2 + 0xc) = 0;
  *(undefined4 *)(in_RDI + 0xc4) = 0;
  *(undefined4 *)&in_RDI[0xc4].field_0x4 = 0;
  *(undefined4 *)&in_RDI[0xc4]._M_string_length = 0;
  *(undefined4 *)((long)&in_RDI[0xc4]._M_string_length + 4) = 0;
  *(undefined4 *)&in_RDI[0xc4].field_2 = 0;
  in_RDI[0xc4].field_2._M_local_buf[4] = '\0';
  *(undefined4 *)((long)&in_RDI[0xc4].field_2 + 8) = 0;
  *(undefined4 *)((long)&in_RDI[0xc4].field_2 + 0xc) = 0;
  *(undefined4 *)(in_RDI + 0xc5) = 0;
  *(undefined4 *)&in_RDI[0xc5].field_0x4 = 0;
  *(undefined4 *)&in_RDI[0xc5]._M_string_length = 0x42480000;
  *(undefined4 *)((long)&in_RDI[0xc5]._M_string_length + 4) = 0x41f00000;
  *(undefined4 *)&in_RDI[0xc5].field_2 = 0;
  *(undefined4 *)((long)&in_RDI[0xc5].field_2 + 4) = 0;
  *(undefined4 *)((long)&in_RDI[0xc5].field_2 + 8) = 0;
  *(undefined4 *)((long)&in_RDI[0xc5].field_2 + 0xc) = 0;
  *(undefined4 *)(in_RDI + 0xc6) = 2;
  *(undefined4 *)&in_RDI[0xc6].field_0x4 = 0;
  *(undefined4 *)&in_RDI[0xc6]._M_string_length = 0;
  *(undefined4 *)((long)&in_RDI[0xc6]._M_string_length + 4) = 0;
  *(undefined4 *)&in_RDI[0xc6].field_2 = 0;
  *(undefined4 *)((long)&in_RDI[0xc6].field_2 + 4) = 0x3f800000;
  *(undefined4 *)((long)&in_RDI[0xc6].field_2 + 8) = 0;
  *(undefined4 *)((long)&in_RDI[0xc6].field_2 + 0xc) = 0;
  *(undefined4 *)(in_RDI + 199) = 0;
  *(undefined4 *)&in_RDI[199].field_0x4 = 0;
  *(undefined4 *)&in_RDI[199]._M_string_length = 0;
  *(undefined4 *)((long)&in_RDI[199]._M_string_length + 4) = 0;
  in_RDI[199].field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&in_RDI[199].field_2 + 8) = 0;
  *(undefined4 *)(in_RDI + 200) = 0;
  *(undefined4 *)&in_RDI[200].field_0x4 = 0;
  *(undefined4 *)&in_RDI[200]._M_string_length = 0;
  *(undefined4 *)((long)&in_RDI[200]._M_string_length + 4) = 0;
  in_RDI[200].field_2._M_local_buf[0] = '\0';
  *(undefined4 *)((long)&in_RDI[200].field_2 + 4) = 0;
  *(undefined4 *)((long)&in_RDI[200].field_2 + 8) = 0;
  *(undefined4 *)((long)&in_RDI[200].field_2 + 0xc) = 0;
  *(undefined4 *)(in_RDI + 0xc9) = 0;
  *(undefined4 *)&in_RDI[0xc9].field_0x4 = 0;
  *(undefined4 *)&in_RDI[0xc9]._M_string_length = 0;
  *(undefined1 *)((long)&in_RDI[0xc9]._M_string_length + 4) = 1;
  *(undefined1 *)((long)&in_RDI[0xc9]._M_string_length + 5) = 0;
  *(undefined1 *)((long)&in_RDI[0xc9]._M_string_length + 6) = 0;
  *(undefined4 *)&in_RDI[0xc9].field_2 = 0;
  in_RDI[0xc9].field_2._M_local_buf[4] = '\x01';
  *(undefined4 *)((long)&in_RDI[0xc9].field_2 + 8) = 0;
  *(undefined4 *)((long)&in_RDI[0xc9].field_2 + 0xc) = 4;
  *(undefined4 *)(in_RDI + 0xca) = 0x2000;
  *(undefined4 *)&in_RDI[0xca].field_0x4 = 0x3dcccccd;
  *(undefined4 *)&in_RDI[0xca]._M_string_length = 0xffffffff;
  *(undefined4 *)((long)&in_RDI[0xca]._M_string_length + 4) = 0;
  *(undefined4 *)&in_RDI[0xca].field_2 = 0xffffffff;
  *(undefined4 *)((long)&in_RDI[0xca].field_2 + 4) = 0;
  llama_vocab::llama_vocab(in_stack_ffffffffffffff90);
  *(undefined8 *)(in_RDI + 0xcb) = 0;
  in_RDI[0xcb]._M_string_length = 0;
  in_RDI[0xcb].field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&in_RDI[0xcb].field_2 + 8) = 0;
  *(undefined8 *)(in_RDI + 0xcc) = 0;
  in_RDI[0xcc]._M_string_length = 0;
  in_RDI[0xcc].field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&in_RDI[0xcc].field_2 + 8) = 0;
  *(undefined8 *)(in_RDI + 0xcd) = 0;
  in_RDI[0xcd]._M_string_length = 0;
  in_RDI[0xcd].field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&in_RDI[0xcd].field_2 + 8) = 0;
  *(undefined8 *)(in_RDI + 0xce) = 0;
  in_RDI[0xce]._M_string_length = 0;
  in_RDI[0xce].field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&in_RDI[0xce].field_2 + 8) = 0;
  std::vector<llama_layer,_std::allocator<llama_layer>_>::vector
            ((vector<llama_layer,_std::allocator<llama_layer>_> *)0x46cef4);
  *(undefined8 *)((long)&in_RDI[0xd1].field_2 + 8) = local_10[8];
  uVar1 = *local_10;
  uVar2 = local_10[1];
  sVar3 = local_10[2];
  sVar4 = local_10[3];
  uVar5 = local_10[4];
  uVar6 = local_10[5];
  sVar7 = local_10[7];
  in_RDI[0xd1]._M_string_length = local_10[6];
  in_RDI[0xd1].field_2._M_allocated_capacity = sVar7;
  *(undefined8 *)((long)&in_RDI[0xd0].field_2 + 8) = uVar5;
  *(undefined8 *)(in_RDI + 0xd1) = uVar6;
  in_RDI[0xd0]._M_string_length = sVar3;
  in_RDI[0xd0].field_2._M_allocated_capacity = sVar4;
  *(undefined8 *)((long)&in_RDI[0xcf].field_2 + 8) = uVar1;
  *(undefined8 *)(in_RDI + 0xd0) = uVar2;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)0x46cf45);
  std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>::vector
            ((vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_> *)0x46cf5b);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
            *)0x46cf71);
  in_RDI[0xd5]._M_string_length = 0;
  in_RDI[0xd5].field_2._M_allocated_capacity = 0;
  std::make_unique<llama_model::impl>();
  local_79 = false;
  if (local_10[1] != 0) {
    local_79 = *(long *)local_10[1] != 0;
  }
  piVar8 = std::unique_ptr<llama_model::impl,_std::default_delete<llama_model::impl>_>::operator->
                     ((unique_ptr<llama_model::impl,_std::default_delete<llama_model::impl>_> *)
                      0x46cfd9);
  piVar8->has_tensor_overrides = local_79;
  return;
}

Assistant:

llama_model::llama_model(const llama_model_params & params) : params(params), pimpl(std::make_unique<impl>()) {
    pimpl->has_tensor_overrides = params.tensor_buft_overrides && params.tensor_buft_overrides[0].pattern;
}